

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

namespace_t __thiscall cs::domain_manager::get_namespace(domain_manager *this)

{
  bool bVar1;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  name_space *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  namespace_t nVar2;
  value_type *it;
  const_iterator __end2;
  const_iterator __begin2;
  domain_type *__range2;
  domain_type *global;
  namespace_t *nm;
  const_iterator *in_stack_ffffffffffffff28;
  domain_type *in_stack_ffffffffffffff30;
  key_arg<std::__cxx11::basic_string<char>_> *in_stack_ffffffffffffff48;
  stack_type<cs::domain_type,_std::allocator> *in_stack_ffffffffffffff70;
  
  std::make_shared<cs::name_space>();
  stack_type<cs::domain_type,_std::allocator>::bottom(in_stack_ffffffffffffff70);
  domain_type::begin_abi_cxx11_((domain_type *)0x4fdadd);
  domain_type::end_abi_cxx11_((domain_type *)0x4fdb10);
  while (bVar1 = phmap::priv::operator!=
                           ((const_iterator *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28),
        bVar1) {
    this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)phmap::priv::
                 raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::const_iterator::operator*((const_iterator *)0x4fdb6b);
    in_stack_ffffffffffffff48 =
         (key_arg<std::__cxx11::basic_string<char>_> *)
         phmap::priv::
         raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
         ::count<std::__cxx11::string>(this_00,in_stack_ffffffffffffff48);
    if (in_stack_ffffffffffffff48 == (key_arg<std::__cxx11::basic_string<char>_> *)0x0) {
      in_stack_ffffffffffffff30 =
           (domain_type *)
           std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4fdbab);
      this_01 = (name_space *)
                domain_type::get_var_by_id
                          (in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
      name_space::add_var(this_01,(string *)this_00,(var *)in_stack_ffffffffffffff30);
    }
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::const_iterator::operator++((const_iterator *)in_stack_ffffffffffffff30);
  }
  nVar2.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  nVar2.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (namespace_t)nVar2.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

namespace_t get_namespace() const
		{
			namespace_t nm = std::make_shared<name_space>();
			const domain_type &global = m_data.bottom();
			for (auto &it: global) {
				if (buildin_symbols.count(it.first) == 0)
					nm->add_var(it.first, global.get_var_by_id(it.second));
			}
			return nm;
		}